

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O0

bool __thiscall Triangle::intersect(Triangle *this,Ray *ray,Hit *hit,float tmin)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  Vector3f *v1;
  Vector2f *rv;
  Vector2f *this_00;
  Vector2f *v1_00;
  long *in_RDX;
  Matrix3f *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  Vector3f tmp;
  Vector3f p;
  float t;
  bool sg;
  Vector3f R;
  Matrix3f L;
  Matrix3f *in_stack_fffffffffffffe38;
  Matrix3f *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Vector3f *in_stack_fffffffffffffe50;
  Matrix3f *in_stack_fffffffffffffe58;
  Matrix3f *m;
  Matrix3f *in_stack_fffffffffffffe60;
  Vector3f *in_stack_fffffffffffffe68;
  Vector2f local_16c [3];
  float in_stack_fffffffffffffeac;
  bool *in_stack_fffffffffffffeb0;
  Matrix3f *in_stack_fffffffffffffeb8;
  Vector2f local_13c [8];
  Vector3f local_f8 [7];
  float local_a4;
  byte local_6d;
  Vector3f local_6c [6];
  float local_24;
  long *local_20;
  Matrix3f *local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    local_24 = in_XMM0_Da;
    local_20 = in_RDX;
    local_18 = in_RSI;
    ::operator-(in_stack_fffffffffffffe68,(Vector3f *)in_stack_fffffffffffffe60);
    ::operator-(in_stack_fffffffffffffe68,(Vector3f *)in_stack_fffffffffffffe60);
    Matrix3f::Matrix3f(in_stack_fffffffffffffe60,(Vector3f *)in_stack_fffffffffffffe58,
                       in_stack_fffffffffffffe50,
                       (Vector3f *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
    ::operator-(in_stack_fffffffffffffe68,(Vector3f *)in_stack_fffffffffffffe60);
    Matrix3f::inverse(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac)
    ;
    Matrix3f::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if ((local_6d & 1) == 0) {
      ::operator*(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      Vector3f::operator=((Vector3f *)in_stack_fffffffffffffe40,
                          (Vector3f *)in_stack_fffffffffffffe38);
      pfVar2 = Vector3f::operator[](local_6c,1);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](local_6c,2);
      if (((1.0 < fVar1 + *pfVar2) || (pfVar2 = Vector3f::operator[](local_6c,1), *pfVar2 < 0.0)) ||
         (pfVar2 = Vector3f::operator[](local_6c,2), *pfVar2 < 0.0)) {
        local_1 = false;
      }
      else {
        pfVar2 = Vector3f::operator[](local_6c,0);
        local_a4 = *pfVar2;
        if ((local_a4 < local_24) || (*(float *)(local_20 + 1) <= local_a4)) {
          local_1 = false;
        }
        else {
          *(float *)(local_20 + 1) = local_a4;
          *local_20 = in_RDI;
          if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
            Vector3f::Vector3f((Vector3f *)in_stack_fffffffffffffe40,
                               (Vector3f *)in_stack_fffffffffffffe38);
          }
          else {
            Vector3f::operator[](local_6c,1);
            ::operator*((float)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50)
            ;
            Vector3f::operator[](local_6c,2);
            ::operator*((float)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50)
            ;
            ::operator+(in_stack_fffffffffffffe68,(Vector3f *)in_stack_fffffffffffffe60);
            Vector3f::operator[](local_6c,1);
            Vector3f::operator[](local_6c,2);
            ::operator*((float)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50)
            ;
            ::operator+(in_stack_fffffffffffffe68,(Vector3f *)in_stack_fffffffffffffe60);
            Vector3f::normalized((Vector3f *)in_stack_fffffffffffffe58);
          }
          Vector3f::operator=((Vector3f *)in_stack_fffffffffffffe40,
                              (Vector3f *)in_stack_fffffffffffffe38);
          uVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
          if ((uVar3 & 1) == 0) {
            Vector2f::Vector2f(local_16c,0.0,0.0);
            Vector2f::operator=((Vector2f *)in_stack_fffffffffffffe40,
                                (Vector2f *)in_stack_fffffffffffffe38);
          }
          else if ((*(byte *)(in_RDI + 0x1a) & 1) == 0) {
            v1 = (Vector3f *)(in_RDI + 0x8c);
            m = local_18;
            ::operator*((Vector3f *)local_18,(float)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            ::operator+(in_stack_fffffffffffffe68,v1);
            ::operator-(in_stack_fffffffffffffe68,v1);
            ::operator*(m,in_stack_fffffffffffffe50);
            ::operator*((Vector3f *)m,(float)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            ::operator+((Vector3f *)local_18,v1);
            pfVar2 = Vector3f::operator[](local_f8,1);
            fVar1 = *pfVar2;
            pfVar2 = Vector3f::operator[](local_f8,2);
            Vector2f::Vector2f(local_13c,fVar1,*pfVar2);
            Vector2f::operator=((Vector2f *)in_stack_fffffffffffffe40,
                                (Vector2f *)in_stack_fffffffffffffe38);
          }
          else {
            rv = (Vector2f *)(in_RDI + 0x1c);
            Vector3f::operator[](local_6c,1);
            ::operator*((Vector2f *)in_stack_fffffffffffffe58,
                        (float)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            this_00 = (Vector2f *)(in_RDI + 0x24);
            Vector3f::operator[](local_6c,2);
            ::operator*((Vector2f *)in_stack_fffffffffffffe58,
                        (float)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            ::operator+((Vector2f *)in_stack_fffffffffffffe58,(Vector2f *)in_stack_fffffffffffffe50)
            ;
            v1_00 = (Vector2f *)(in_RDI + 0x2c);
            Vector3f::operator[](local_6c,1);
            Vector3f::operator[](local_6c,2);
            ::operator*((Vector2f *)in_stack_fffffffffffffe58,(float)((ulong)v1_00 >> 0x20));
            ::operator+((Vector2f *)in_stack_fffffffffffffe58,v1_00);
            Vector2f::operator=(this_00,rv);
          }
          local_1 = true;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& ray, Hit& hit, float tmin) override {
		if (empty) return 0;
		Matrix3f L(ray.d, v[2] - v[0], v[2] - v[1], 1);
		Vector3f R = v[2] - ray.o;
		bool sg; L = L.inverse(&sg);
		if (sg) return 0; R = L * R;
		if (R[1] + R[2] > 1 || R[1] < 0 || R[2] < 0) return 0;
		float t = R[0];
		if (t < tmin || t >= hit.t) return 0;
		hit.t = t; hit.obj = this;
		hit.norm = use_n?((R[1]*n[0]+R[2]*n[1]+(1-R[1]-R[2])*n[2]).normalized()):n[0];
		if (m->need_coords()) {
			if (!has_uv) {
				Vector3f p = matrix * (ray.o + ray.d * t - o);
				Vector3f tmp = ray.o + ray.d * t;
	//			cerr << tmp[0] << "," << tmp[1] << "," << tmp[2] << ":" << p[1] << "," << p[2] << "\n";
				hit.pos = Vector2f(p[1], p[2]);
			}
			else {
				hit.pos = uv[0] * R[1] + uv[1] * R[2] + uv[2] * (1 - R[1] - R[2]);
			}
		}
		else hit.pos = Vector2f(0, 0);
		return 1;
	}